

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

void xmlTextWriterStartDocumentCallback(void *ctx)

{
  code *pcVar1;
  htmlDocPtr pxVar2;
  xmlDocPtr pxVar3;
  xmlChar *pxVar4;
  
  pxVar3 = *(xmlDocPtr *)((long)ctx + 0x10);
  if (*(int *)((long)ctx + 0x34) == 0) {
    if (pxVar3 == (xmlDocPtr)0x0) {
      pxVar3 = xmlNewDoc(*(xmlChar **)((long)ctx + 0x20));
      *(xmlDocPtr *)((long)ctx + 0x10) = pxVar3;
    }
    if (pxVar3 != (xmlDocPtr)0x0) {
      if (pxVar3->children == (_xmlNode *)0x0) {
        if (*(xmlChar **)((long)ctx + 0x28) == (xmlChar *)0x0) {
          pxVar4 = (xmlChar *)0x0;
        }
        else {
          pxVar4 = xmlStrdup(*(xmlChar **)((long)ctx + 0x28));
        }
        pxVar3->encoding = pxVar4;
        pxVar3->standalone = *(int *)((long)ctx + 0x30);
      }
      goto LAB_001d3a2f;
    }
  }
  else {
    if (pxVar3 == (xmlDocPtr)0x0) {
      pxVar2 = htmlNewDocNoDtD((xmlChar *)0x0,(xmlChar *)0x0);
      *(htmlDocPtr *)((long)ctx + 0x10) = pxVar2;
    }
    if (*(long *)((long)ctx + 0x10) != 0) {
LAB_001d3a2f:
      if (*(long *)((long)ctx + 0x10) == 0) {
        return;
      }
      if (*(long *)(*(long *)((long)ctx + 0x10) + 0x88) != 0) {
        return;
      }
      if (*(long *)((long)ctx + 0x38) == 0) {
        return;
      }
      pxVar4 = *(xmlChar **)(*(long *)((long)ctx + 0x38) + 8);
      if (pxVar4 == (xmlChar *)0x0) {
        return;
      }
      pxVar4 = xmlCanonicPath(pxVar4);
      *(xmlChar **)(*(long *)((long)ctx + 0x10) + 0x88) = pxVar4;
      if (pxVar4 != (xmlChar *)0x0) {
        return;
      }
      pxVar4 = xmlStrdup(*(xmlChar **)(*(long *)((long)ctx + 0x38) + 8));
      *(xmlChar **)(*(long *)((long)ctx + 0x10) + 0x88) = pxVar4;
      return;
    }
  }
  if ((*ctx != 0) && (pcVar1 = *(code **)(*ctx + 0xb0), pcVar1 != (code *)0x0)) {
    (*pcVar1)(*(undefined8 *)((long)ctx + 8),"SAX.startDocument(): out of memory\n");
  }
  *(undefined4 *)((long)ctx + 0x88) = 2;
  *(undefined4 *)((long)ctx + 0x110) = 0xffffffff;
  *(undefined4 *)((long)ctx + 0x14c) = 1;
  return;
}

Assistant:

static void
xmlTextWriterStartDocumentCallback(void *ctx)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlDocPtr doc;

    if (ctxt->html) {
#ifdef LIBXML_HTML_ENABLED
        if (ctxt->myDoc == NULL)
            ctxt->myDoc = htmlNewDocNoDtD(NULL, NULL);
        if (ctxt->myDoc == NULL) {
            if ((ctxt->sax != NULL) && (ctxt->sax->error != NULL))
                ctxt->sax->error(ctxt->userData,
                                 "SAX.startDocument(): out of memory\n");
            ctxt->errNo = XML_ERR_NO_MEMORY;
            ctxt->instate = XML_PARSER_EOF;
            ctxt->disableSAX = 1;
            return;
        }
#else
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                        "libxml2 built without HTML support\n");
        ctxt->errNo = XML_ERR_INTERNAL_ERROR;
        ctxt->instate = XML_PARSER_EOF;
        ctxt->disableSAX = 1;
        return;
#endif
    } else {
        doc = ctxt->myDoc;
        if (doc == NULL)
            doc = ctxt->myDoc = xmlNewDoc(ctxt->version);
        if (doc != NULL) {
            if (doc->children == NULL) {
                if (ctxt->encoding != NULL)
                    doc->encoding = xmlStrdup(ctxt->encoding);
                else
                    doc->encoding = NULL;
                doc->standalone = ctxt->standalone;
            }
        } else {
            if ((ctxt->sax != NULL) && (ctxt->sax->error != NULL))
                ctxt->sax->error(ctxt->userData,
                                 "SAX.startDocument(): out of memory\n");
            ctxt->errNo = XML_ERR_NO_MEMORY;
            ctxt->instate = XML_PARSER_EOF;
            ctxt->disableSAX = 1;
            return;
        }
    }
    if ((ctxt->myDoc != NULL) && (ctxt->myDoc->URL == NULL) &&
        (ctxt->input != NULL) && (ctxt->input->filename != NULL)) {
        ctxt->myDoc->URL =
            xmlCanonicPath((const xmlChar *) ctxt->input->filename);
        if (ctxt->myDoc->URL == NULL)
            ctxt->myDoc->URL =
                xmlStrdup((const xmlChar *) ctxt->input->filename);
    }
}